

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

list_entry_t __thiscall
duckdb::ListSliceOperations::SliceValueWithSteps
          (ListSliceOperations *this,Vector *result,SelectionVector *sel,list_entry_t input,
          int64_t begin,int64_t end,int64_t step,idx_t *sel_idx)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  idx_t iVar4;
  uint64_t uVar5;
  idx_t iVar6;
  list_entry_t lVar7;
  
  if (begin == input.length) {
    uVar3 = *(uint64_t *)step;
    iVar4 = 0;
  }
  else {
    iVar4 = CalculateSliceLength<long>(input.length,begin,end,true);
    uVar3 = *(uint64_t *)step;
    lVar1 = *(long *)result;
    iVar6 = iVar4;
    iVar2 = (int)sel + -1 + (int)begin;
    uVar5 = uVar3;
    if (-1 < end) {
      iVar2 = (int)input.length + (int)sel;
    }
    while( true ) {
      uVar5 = uVar5 + 1;
      if (iVar6 == 0) break;
      *(int *)(lVar1 + -4 + uVar5 * 4) = iVar2;
      *(uint64_t *)step = uVar5;
      iVar6 = iVar6 - 1;
      iVar2 = iVar2 + (int)end;
    }
  }
  lVar7.length = iVar4;
  lVar7.offset = uVar3;
  return lVar7;
}

Assistant:

static list_entry_t SliceValueWithSteps(Vector &result, SelectionVector &sel, list_entry_t input, int64_t begin,
	                                        int64_t end, int64_t step, idx_t &sel_idx) {
		if (end - begin == 0) {
			input.length = 0;
			input.offset = sel_idx;
			return input;
		}
		input.length = CalculateSliceLength(UnsafeNumericCast<idx_t>(begin), UnsafeNumericCast<idx_t>(end), step, true);
		idx_t child_idx = input.offset + UnsafeNumericCast<idx_t>(begin);
		if (step < 0) {
			child_idx = input.offset + UnsafeNumericCast<idx_t>(end) - 1;
		}
		input.offset = sel_idx;
		for (idx_t i = 0; i < input.length; i++) {
			sel.set_index(sel_idx, child_idx);
			child_idx += static_cast<idx_t>(step); // intentional overflow??
			sel_idx++;
		}
		return input;
	}